

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

int xc_maximum_name_length(void)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  int *piVar4;
  xc_functional_key_t *__s;
  int iVar5;
  ulong uVar6;
  
  piVar4 = &xc_functional_keys[0].number;
  lVar2 = 1;
  do {
    lVar2 = lVar2 + -1;
    iVar5 = *piVar4;
    piVar4 = piVar4 + 0x41;
  } while (iVar5 != -1);
  if (lVar2 == 0) {
    iVar5 = 0;
  }
  else {
    uVar6 = 1;
    if (1 < -(int)lVar2) {
      uVar6 = (ulong)(uint)-(int)lVar2;
    }
    iVar5 = 0;
    __s = xc_functional_keys;
    do {
      sVar3 = strlen(__s->name);
      iVar1 = (int)sVar3;
      if ((int)sVar3 < iVar5) {
        iVar1 = iVar5;
      }
      iVar5 = iVar1;
      __s = __s + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return iVar5;
}

Assistant:

int xc_maximum_name_length(void)
{
  int i, N, maxlen, tmp;

  N=xc_number_of_functionals();

  maxlen=0;
  for(i=0;i<N;i++){
    tmp=strlen(xc_functional_keys[i].name);
    if(tmp > maxlen) maxlen=tmp;
  }

  return maxlen;
}